

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O0

void skip_variable(void)

{
  uint uVar1;
  uint length;
  int local_4;
  
  uVar1 = read_2_bytes();
  if (uVar1 < 2) {
    fprintf(_stderr,"%s\n","Erroneous JPEG marker length");
    exit(1);
  }
  for (local_4 = uVar1 - 2; local_4 != 0; local_4 = local_4 + -1) {
    read_1_byte();
  }
  return;
}

Assistant:

static void
skip_variable(void)
/* Skip over an unknown or uninteresting variable-length marker */
{
  unsigned int length;

  /* Get the marker parameter length count */
  length = read_2_bytes();
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;
  /* Skip over the remaining bytes */
  while (length > 0) {
    (void)read_1_byte();
    length--;
  }
}